

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O1

int __thiscall
QAbstractItemViewPrivate::delegateRefCount
          (QAbstractItemViewPrivate *this,QAbstractItemDelegate *delegate)

{
  Data *pDVar1;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  QObject *pQVar8;
  uint unaff_EBP;
  _Rb_tree_node_base *p_Var9;
  int iVar10;
  bool bVar11;
  
  pDVar1 = (this->itemDelegate).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar8 = (QObject *)0x0;
  }
  else {
    pQVar8 = (this->itemDelegate).wp.value;
  }
  uVar3 = (uint)(pQVar8 == &delegate->super_QObject);
  iVar10 = 0;
  do {
    pQVar2 = (&this->rowDelegates)[iVar10 != 0].d.d.ptr;
    if (pQVar2 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                   *)0x0) {
      p_Var7 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var7 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl + 0x18);
    }
    p_Var9 = (_Rb_tree_node_base *)((long)&(pQVar2->m)._M_t._M_impl + 8);
    if (pQVar2 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                   *)0x0) {
      p_Var9 = (_Rb_tree_node_base *)0x0;
    }
    while (uVar4 = unaff_EBP, p_Var7 != p_Var9) {
      if ((p_Var7[1]._M_parent == (_Base_ptr)0x0) ||
         (*(int *)&(p_Var7[1]._M_parent)->field_0x4 == 0)) {
        p_Var6 = (_Base_ptr)0x0;
      }
      else {
        p_Var6 = p_Var7[1]._M_left;
      }
      uVar4 = uVar3;
      if ((p_Var6 == (_Base_ptr)delegate) &&
         (uVar4 = uVar3 + 1, bVar11 = 0 < (int)uVar3, uVar3 = uVar4, bVar11)) break;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      uVar3 = uVar4;
    }
    uVar5 = uVar4;
    if ((p_Var7 != p_Var9) ||
       (bVar11 = iVar10 != 0, iVar10 = iVar10 + 1, uVar5 = uVar3, unaff_EBP = uVar4, bVar11)) {
      return uVar5;
    }
  } while( true );
}

Assistant:

int delegateRefCount(const QAbstractItemDelegate *delegate) const
    {
        int ref = 0;
        if (itemDelegate == delegate)
            ++ref;

        for (int maps = 0; maps < 2; ++maps) {
            const QMap<int, QPointer<QAbstractItemDelegate> > *delegates = maps ? &columnDelegates : &rowDelegates;
            for (QMap<int, QPointer<QAbstractItemDelegate> >::const_iterator it = delegates->begin();
                it != delegates->end(); ++it) {
                    if (it.value() == delegate) {
                        ++ref;
                        // optimization, we are only interested in the ref count values 0, 1 or >=2
                        if (ref >= 2) {
                            return ref;
                        }
                    }
            }
        }
        return ref;
    }